

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O2

Path * __thiscall
FileSystemUtils::Path::DelimitersToOSDefault(Path *__return_storage_ptr__,Path *this)

{
  pointer pcVar1;
  size_t i;
  ulong uVar2;
  
  Path(__return_storage_ptr__,&this->m_string);
  for (uVar2 = 0; uVar2 < (__return_storage_ptr__->m_string)._M_string_length; uVar2 = uVar2 + 1) {
    pcVar1 = (__return_storage_ptr__->m_string)._M_dataplus._M_p;
    if (pcVar1[uVar2] == '\\') {
      pcVar1[uVar2] = '/';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Path Path::DelimitersToOSDefault()	const
	{
		Path path = m_string;
		for( size_t i = 0; i < path.m_string.size(); ++i )
		{
			if( path.m_string[i] == altseperator )
			{
				path.m_string[i] = seperator;
			}
		}
		return path;
	}